

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

Bit32u __thiscall MT32Emu::Synth::addMIDIInterfaceDelay(Synth *this,Bit32u len,Bit32u timestamp)

{
  Bit32u BVar1;
  
  if ((int)(timestamp - this->lastReceivedMIDIEventTimestamp) < 0) {
    timestamp = this->lastReceivedMIDIEventTimestamp;
  }
  BVar1 = (int)(long)((double)len * 8.192) + timestamp;
  this->lastReceivedMIDIEventTimestamp = BVar1;
  return BVar1;
}

Assistant:

Bit32u Synth::addMIDIInterfaceDelay(Bit32u len, Bit32u timestamp) {
	Bit32u transferTime =  Bit32u(double(len) * MIDI_DATA_TRANSFER_RATE);
	// Dealing with wrapping
	if (Bit32s(timestamp - lastReceivedMIDIEventTimestamp) < 0) {
		timestamp = lastReceivedMIDIEventTimestamp;
	}
	timestamp += transferTime;
	lastReceivedMIDIEventTimestamp = timestamp;
	return timestamp;
}